

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall kj::UnixEventPort::preparePollableFdForSleep(UnixEventPort *this)

{
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> MVar1;
  Fault f;
  DebugComparison<kj::UnixEventPort::SignalPromiseAdapter_*&,_std::nullptr_t> _kjCondition;
  undefined1 local_20 [16];
  
  _kjCondition.left = &this->signalHead;
  _kjCondition.result = this->signalHead == (SignalPromiseAdapter *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::UnixEventPort::SignalPromiseAdapter*&,decltype(nullptr)>&,char_const(&)[68]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x2e1,FAILED,"signalHead == nullptr",
               "_kjCondition,\"preparePollableFdForSleep() cannot be used when waiting for signals\""
               ,&_kjCondition,
               (char (*) [68])"preparePollableFdForSleep() cannot be used when waiting for signals")
    ;
    kj::_::Debug::Fault::fatal(&f);
  }
  if (this->runnable == true) {
    (*(this->super_EventPort)._vptr_EventPort[3])(this);
    return;
  }
  MVar1 = TimerImpl::nextEvent(&this->timerImpl);
  (*(this->super_EventPort)._vptr_EventPort[4])(this,local_20,MVar1.ptr.field_1);
  this->sleeping = true;
  (this->timerImpl).sleepHooks.ptr = &this->super_SleepHooks;
  return;
}

Assistant:

void UnixEventPort::preparePollableFdForSleep() {
  KJ_ASSERT(signalHead == nullptr,
      "preparePollableFdForSleep() cannot be used when waiting for signals");

  if (runnable) {
    // There is still immediate work in the queue, so force the epoll to be ready immediately. (See
    // comments in setRunnable() regarding using wake() for this.)
    wake();
  } else {
    updateNextTimerEvent(timerImpl.nextEvent());

    // Flag that we're sleeping, so setRunnable() knows to use wake() if needed.
    sleeping = true;

    // Tell the timer we're sleeping, so that it notifies us if anyone tries to create a new time
    // event.
    timerImpl.setSleeping(*this);
  }
}